

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O1

void __thiscall tst_RootIndexProxyModel::replaceModel_data(tst_RootIndexProxyModel *this)

{
  QAbstractItemModel *pQVar1;
  __atomic_base<int> _Var2;
  QTestData *pQVar3;
  QAbstractItemModel *replaceModel;
  QAbstractItemModel *baseModel;
  QMetaTypeInterface *local_b8 [3];
  QAbstractItemModel *local_a0;
  QAbstractItemModel *local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [24];
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_b8[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var2._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
               super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var2._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var2._M_i,"baseModel");
  QTest::addColumnInternal(0x2a,"baseRoot");
  local_b8[0] = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType;
  _Var2._M_i = (__int_type)
               QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId;
  if ((__atomic_base<int>)
      QtPrivate::QMetaTypeInterfaceWrapper<QAbstractItemModel_*>::metaType.typeId._q_value.
      super___atomic_base<int>._M_i == (__atomic_base<int>)0x0) {
    _Var2._M_i = QMetaType::idHelper();
  }
  QTest::addColumnInternal(_Var2._M_i,"replaceModel");
  QTest::addColumnInternal(0x2a,"replaceRoot");
  local_98 = createTreeModel(&this->super_QObject);
  local_a0 = createTreeModel(&this->super_QObject);
  pQVar3 = (QTestData *)QTest::newRow("Child");
  pQVar3 = operator<<(pQVar3,&local_98);
  local_60 = 0xffffffffffffffff;
  local_58 = 0;
  uStack_50 = 0;
  (**(code **)(*(long *)local_98 + 0x60))(local_b8,local_98,1,0,&local_60);
  QTestData::append((int)pQVar3,(void *)0x2a);
  pQVar3 = operator<<(pQVar3,&local_a0);
  local_90 = 0xffffffffffffffff;
  local_88 = 0;
  uStack_80 = 0;
  (**(code **)(*(long *)local_a0 + 0x60))(local_78,local_a0,0,0);
  QTestData::append((int)pQVar3,(void *)0x2a);
  local_98 = createTreeModel(&this->super_QObject);
  local_a0 = createTreeModel(&this->super_QObject);
  pQVar3 = (QTestData *)QTest::newRow("Grandchild");
  pQVar3 = operator<<(pQVar3,&local_98);
  local_60 = 0xffffffffffffffff;
  local_58 = 0;
  uStack_50 = 0;
  (**(code **)(*(long *)local_98 + 0x60))(local_b8,local_98,1,0,&local_60);
  QTestData::append((int)pQVar3,(void *)0x2a);
  pQVar3 = operator<<(pQVar3,&local_a0);
  pQVar1 = local_a0;
  local_48 = 0xffffffffffffffff;
  local_40 = 0;
  uStack_38 = 0;
  (**(code **)(*(long *)local_a0 + 0x60))(&local_90,local_a0,1,0);
  (**(code **)(*(long *)pQVar1 + 0x60))(local_78,pQVar1,2,0,&local_90);
  QTestData::append((int)pQVar3,(void *)0x2a);
  return;
}

Assistant:

void tst_RootIndexProxyModel::replaceModel_data()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QTest::addColumn<QAbstractItemModel *>("baseModel");
    QTest::addColumn<QModelIndex>("baseRoot");
    QTest::addColumn<QAbstractItemModel *>("replaceModel");
    QTest::addColumn<QModelIndex>("replaceRoot");

    QAbstractItemModel *baseModel = createTreeModel(this);
    QAbstractItemModel *replaceModel = createTreeModel(this);
    QTest::newRow("Child") << baseModel << baseModel->index(1, 0) << replaceModel << replaceModel->index(0, 0);
    baseModel = createTreeModel(this);
    replaceModel = createTreeModel(this);
    QTest::newRow("Grandchild") << baseModel << baseModel->index(1, 0) << replaceModel << replaceModel->index(2, 0, replaceModel->index(1, 0));
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}